

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::updateLabel(QLabelPrivate *this)

{
  bool bVar1;
  QRect *rect;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 b;
  bool wrap;
  QLabel *q;
  QSizePolicy policy;
  QWidget *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_10;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  rect = (QRect *)q_func(in_RDI);
  *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xfffe;
  if ((*(ushort *)&in_RDI->field_0x340 >> 4 & 1) != 0) {
    local_c.data = 0xaaaaaaaa;
    local_c.bits = (Bits)QWidget::sizePolicy(in_stack_ffffffffffffffb0);
    b = (in_RDI->align & 0x1000U) != 0;
    QSizePolicy::setHeightForWidth((QSizePolicy *)&local_c.bits,(bool)b);
    local_10.bits = (Bits)QWidget::sizePolicy(in_stack_ffffffffffffffb0);
    bVar1 = QSizePolicy::operator!=((QSizePolicy *)&local_c.bits,(QSizePolicy *)&local_10.bits);
    if (bVar1) {
      QWidget::setSizePolicy
                ((QWidget *)CONCAT17(b,in_stack_ffffffffffffffc0),
                 (QSizePolicy)SUB84((ulong)rect >> 0x20,0));
    }
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xfffb | 4;
  }
  QWidget::updateGeometry(in_stack_ffffffffffffffb0);
  QWidget::contentsRect((QWidget *)in_RDI);
  QWidget::update((QWidget *)in_RDI,rect);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::updateLabel()
{
    Q_Q(QLabel);
    valid_hints = false;

    if (isTextLabel) {
        QSizePolicy policy = q->sizePolicy();
        const bool wrap = align & Qt::TextWordWrap;
        policy.setHeightForWidth(wrap);
        if (policy != q->sizePolicy())  // ### should be replaced by WA_WState_OwnSizePolicy idiom
            q->setSizePolicy(policy);
        textLayoutDirty = true;
    }
    q->updateGeometry();
    q->update(q->contentsRect());
}